

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-impl-ncurses.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_31576::VSync::VSync(VSync *this,double fps_active,double fps_idle)

{
  ulong uVar1;
  uint64_t uVar2;
  ulong *in_RDI;
  VSync *in_XMM0_Qa;
  double in_XMM1_Qa;
  
  uVar1 = (ulong)(1000000.0 / (double)in_XMM0_Qa);
  *in_RDI = uVar1 | (long)(1000000.0 / (double)in_XMM0_Qa - 9.223372036854776e+18) &
                    (long)uVar1 >> 0x3f;
  uVar1 = (ulong)(1000000.0 / in_XMM1_Qa);
  in_RDI[1] = uVar1 | (long)(1000000.0 / in_XMM1_Qa - 9.223372036854776e+18) & (long)uVar1 >> 0x3f;
  uVar2 = t_us(in_XMM0_Qa);
  in_RDI[2] = uVar2;
  in_RDI[3] = in_RDI[2];
  return;
}

Assistant:

VSync(double fps_active = 60.0, double fps_idle = 60.0) :
            tStepActive_us(1000000.0/fps_active),
            tStepIdle_us(1000000.0/fps_idle) {}